

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TreeNodeExV(char *str_id,ImGuiTreeNodeFlags flags,char *fmt,__va_list_tag *args)

{
  ImGuiID id;
  char *local_48;
  char *label_end;
  char *label;
  ImGuiWindow *window;
  __va_list_tag *args_local;
  char *fmt_local;
  char *pcStack_18;
  ImGuiTreeNodeFlags flags_local;
  char *str_id_local;
  
  window = (ImGuiWindow *)args;
  args_local = (__va_list_tag *)fmt;
  fmt_local._4_4_ = flags;
  pcStack_18 = str_id;
  label = (char *)GetCurrentWindow();
  if ((((ImGuiWindow *)label)->SkipItems & 1U) == 0) {
    ImFormatStringToTempBufferV(&label_end,&local_48,(char *)args_local,(__va_list_tag *)window);
    id = ImGuiWindow::GetID((ImGuiWindow *)label,pcStack_18,(char *)0x0);
    str_id_local._7_1_ = TreeNodeBehavior(id,fmt_local._4_4_,label_end,local_48);
  }
  else {
    str_id_local._7_1_ = false;
  }
  return str_id_local._7_1_;
}

Assistant:

bool ImGui::TreeNodeExV(const char* str_id, ImGuiTreeNodeFlags flags, const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const char* label, *label_end;
    ImFormatStringToTempBufferV(&label, &label_end, fmt, args);
    return TreeNodeBehavior(window->GetID(str_id), flags, label, label_end);
}